

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O0

void duckdb::FirstFunctionString<false,true>::
     Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<false,true>>
               (FirstState<duckdb::string_t> *state,string_t *input,AggregateUnaryInput *unary_input
               )

{
  undefined8 in_RSI;
  undefined1 is_null;
  AggregateInputData *in_RDI;
  FirstState<duckdb::string_t> *unaff_retaddr;
  anon_union_16_2_67f50693_for_value in_stack_00000008;
  
  is_null = (undefined1)((ulong)in_RSI >> 0x38);
  if ((in_RDI->combine_type & PRESERVE_INPUT) == 0) {
    AggregateUnaryInput::RowIsValid((AggregateUnaryInput *)0xf93274);
    FirstFunctionStringBase<false,true>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
              (unaff_retaddr,in_RDI,(string_t)in_stack_00000008,(bool)is_null);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, unary_input.input, input,
			                                                                    !unary_input.RowIsValid());
		}
	}